

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O2

EvaluationResult __thiscall
chatra::TemporaryObject::evaluateDirect(TemporaryObject *this,bool throwIfNotFound)

{
  pointer ppCVar1;
  Node *pNVar2;
  Reference RVar3;
  pointer pAVar4;
  Thread *pTVar5;
  bool bVar6;
  byte bVar7;
  Class *pCVar8;
  undefined8 *puVar9;
  uint *cl;
  pointer ppCVar10;
  StringId SVar11;
  long lVar12;
  pointer_____offset_0x10___ *ppuVar13;
  string *this_00;
  long lVar14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string local_d8;
  string local_b8;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  Node *local_60;
  string local_58;
  allocator local_32;
  allocator_type local_31;
  
  cl = &switchD_00147275::switchdataD_001b5b34;
  switch(this->type) {
  case Rvalue:
  case ScopeRef:
  case ObjectRef:
  case Self:
    RVar3.node = (this->targetRef).node;
    pCVar8 = (Class *)(RVar3.node)->object[1]._vptr_Object;
    cl = (uint *)0x0;
    bVar6 = findOnObject(this,RVar3,&pCVar8->methods,(Class *)0x0,Invalid);
    if (bVar6) {
      return Succeeded;
    }
    break;
  case Package:
    pCVar8 = Package::findClass(this->package,this->name);
    if (pCVar8 != (Class *)0x0) {
      if (this->hasArgs == false) {
        setClass(this,pCVar8);
        return Succeeded;
      }
      bVar6 = findConstructor(this,pCVar8,Invalid);
      if (bVar6) {
        return Succeeded;
      }
    }
    bVar6 = findOnPackage(this,this->package);
    if (bVar6) {
      return Succeeded;
    }
    pCVar8 = (Class *)0x0;
    break;
  case Class:
    if (this->hasArgs != false) {
      if (this->hasName == false) {
        SVar11 = Invalid;
      }
      else {
        SVar11 = this->name;
      }
      bVar6 = findConstructor(this,this->cl,SVar11);
      if (bVar6) {
        return Succeeded;
      }
      pNVar2 = this->node;
      if (pNVar2 != (Node *)0x0) {
        pTVar5 = this->thread;
        std::__cxx11::string::string
                  ((string *)&local_d8,"constructor not found",(allocator *)&local_78);
        local_58._M_dataplus._M_p = (pointer)0x0;
        local_58._M_string_length = 0;
        local_58.field_2._M_allocated_capacity = 0;
        errorAtNode(&pTVar5->super_IErrorReceiver,Error,pNVar2,&local_d8,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_58);
        goto LAB_0014765a;
      }
      goto LAB_0014766f;
    }
    pNVar2 = this->node;
    if (pNVar2 != (Node *)0x0) {
      pTVar5 = this->thread;
      std::__cxx11::string::string
                ((string *)&local_d8,"cannot use element selection operator on a class",
                 (allocator *)&local_78);
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0;
      errorAtNode(&pTVar5->super_IErrorReceiver,Error,pNVar2,&local_d8,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar9 = &PTR__exception_0023dab8;
    *(undefined4 *)(puVar9 + 1) = 0x83;
    goto LAB_00147782;
  default:
    puVar9 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar9 = &PTR__exception_0023db80;
    ppuVar13 = &InternalError::typeinfo;
    goto LAB_00147789;
  case Super:
    bVar7 = this->hasName;
    if ((bool)bVar7 == true) {
      ppCVar10 = (this->cl->directParents).
                 super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppCVar1 = (this->cl->directParents).
                super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      lVar12 = (long)ppCVar1 - (long)ppCVar10;
      SVar11 = this->name;
      for (lVar14 = lVar12 >> 5; 0 < lVar14; lVar14 = lVar14 + -1) {
        if ((*ppCVar10)->name == SVar11) goto LAB_001474d4;
        if (ppCVar10[1]->name == SVar11) {
          ppCVar10 = ppCVar10 + 1;
          goto LAB_001474d4;
        }
        if (ppCVar10[2]->name == SVar11) {
          ppCVar10 = ppCVar10 + 2;
          goto LAB_001474d4;
        }
        if (ppCVar10[3]->name == SVar11) {
          ppCVar10 = ppCVar10 + 3;
          goto LAB_001474d4;
        }
        ppCVar10 = ppCVar10 + 4;
        lVar12 = lVar12 + -0x20;
      }
      lVar12 = lVar12 >> 3;
      if (lVar12 == 1) {
LAB_001474b8:
        if ((*ppCVar10)->name != SVar11) {
          ppCVar10 = ppCVar1;
        }
      }
      else if (lVar12 == 2) {
LAB_001474ac:
        if ((*ppCVar10)->name != SVar11) {
          ppCVar10 = ppCVar10 + 1;
          goto LAB_001474b8;
        }
      }
      else {
        if (lVar12 != 3) goto LAB_00147505;
        if ((*ppCVar10)->name != SVar11) {
          ppCVar10 = ppCVar10 + 1;
          goto LAB_001474ac;
        }
      }
LAB_001474d4:
      if (ppCVar10 != ppCVar1) {
        pCVar8 = *ppCVar10;
        RVar3.node = (this->targetRef).node;
        if (this->hasArgs == false) {
          this->type = ExplicitSuper;
          (this->targetRef).node = RVar3.node;
          this->cl = pCVar8;
          this->hasName = false;
          this->hasArgs = false;
          this->hasSetArg = false;
          this->hasVarArgOp = false;
          pAVar4 = (this->args).
                   super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((this->args).
              super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
              _M_impl.super__Vector_impl_data._M_finish != pAVar4) {
            (this->args).
            super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
            super__Vector_impl_data._M_finish = pAVar4;
            return Succeeded;
          }
          return Succeeded;
        }
        bVar6 = findConstructorCall(this,RVar3,pCVar8,Invalid);
        if (bVar6) {
          return Succeeded;
        }
        bVar7 = this->hasName;
      }
    }
LAB_00147505:
    if (((bVar7 & 1) != 0) && (this->hasArgs == true)) {
      ppCVar10 = (this->cl->directParents).
                 super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppCVar1 = (this->cl->directParents).
                super__Vector_base<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      while (ppCVar10 != ppCVar1) {
        bVar6 = findConstructorCall(this,(this->targetRef).node,*ppCVar10,this->name);
        ppCVar10 = ppCVar10 + 1;
        if (bVar6) {
          return Succeeded;
        }
      }
    }
    cl = (uint *)0x0;
    bVar6 = findOnObject(this,(this->targetRef).node,&this->cl->superMethods,(Class *)0x0,Invalid);
    if (bVar6) {
      return Succeeded;
    }
    goto LAB_00147573;
  case ExplicitSuper:
    if (((this->hasName == true) && (this->hasArgs == true)) &&
       (bVar6 = findConstructorCall(this,(this->targetRef).node,this->cl,this->name), bVar6)) {
      return Succeeded;
    }
    cl = (uint *)this->cl;
    bVar6 = findOnObject(this,(this->targetRef).node,&((Class *)cl)->methods,(Class *)cl,Invalid);
    if (bVar6) {
      return Succeeded;
    }
LAB_00147573:
    pCVar8 = this->cl;
  }
  bVar6 = partialEvaluation(this,0xffffffffffffffff,pCVar8);
  if (!throwIfNotFound || bVar6) {
    return bVar6 + Failed;
  }
  pTVar5 = this->thread;
  local_60 = this->node;
  if (pCVar8 == (Class *)0x0) {
    std::__cxx11::string::string((string *)&local_d8,"expected expression",(allocator *)&local_78);
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    errorAtNode(&pTVar5->super_IErrorReceiver,Error,local_60,&local_d8,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58);
LAB_0014765a:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
    this_00 = &local_d8;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_58,"no method or member named \"${0}${1}\" in class \"${2}\"",
               &local_32);
    StringTable::ref_abi_cxx11_(&local_d8,this->thread->sTable,this->name);
    toString_abi_cxx11_(&local_b8,(chatra *)this->thread->sTable,(StringTable *)&this->args,
                        (vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *)cl);
    StringTable::ref_abi_cxx11_(&local_98,this->thread->sTable,pCVar8->name);
    __l._M_len = 3;
    __l._M_array = &local_d8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_78,__l,&local_31);
    errorAtNode(&pTVar5->super_IErrorReceiver,Error,local_60,&local_58,&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    lVar12 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&local_d8._M_dataplus._M_p + lVar12));
      lVar12 = lVar12 + -0x20;
    } while (lVar12 != -0x20);
    this_00 = &local_58;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_0014766f:
  puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar9 = &PTR__exception_0023dab8;
  *(undefined4 *)(puVar9 + 1) = 0x86;
LAB_00147782:
  ppuVar13 = &RuntimeException::typeinfo;
LAB_00147789:
  __cxa_throw(puVar9,ppuVar13,std::exception::~exception);
}

Assistant:

TemporaryObject::EvaluationResult TemporaryObject::evaluateDirect(bool throwIfNotFound) {
	const Class* clTarget;
	switch (type) {
	case Type::Rvalue:
		clTarget = targetRef.deref<ObjectBase>().getClass();
		if (findOnObject(targetRef, clTarget->refMethods(), nullptr))
			return EvaluationResult::Succeeded;
		break;

	case Type::Package: {
		auto* cl = package->findClass(name);
		if (cl != nullptr) {
			if (!hasArgs) {
				setClass(cl);
				return EvaluationResult::Succeeded;
			}
			if (findConstructor(cl, StringId::Invalid))
				return EvaluationResult::Succeeded;
		}

		if (findOnPackage(package))
			return EvaluationResult::Succeeded;

		clTarget = nullptr;
		break;
	}

	case Type::Class: {
		if (!hasArgs) {
			if (node != nullptr)
				errorAtNode(thread, ErrorLevel::Error, node, "cannot use element selection operator on a class", {});
			throw RuntimeException(StringId::UnsupportedOperationException);
		}
		if (findConstructor(cl, hasName ? name : StringId::Invalid))
			return EvaluationResult::Succeeded;

		if (node != nullptr)
			errorAtNode(thread, ErrorLevel::Error, node, "constructor not found", {});
		throw RuntimeException(StringId::MemberNotFoundException);
	}

	case Type::Constructor:
	case Type::FrameMethod:
	case Type::ObjectMethod:
		throw InternalError();

	case Type::ScopeRef:
	case Type::ObjectRef:
	case Type::Self:
		clTarget = targetRef.deref<ObjectBase>().getClass();
		if (findOnObject(targetRef, clTarget->refMethods(), nullptr))
			return EvaluationResult::Succeeded;
		break;

	case Type::Super: {
		// check "super.Class" or "super.Class()" style
		if (hasName) {
			auto& clParents = cl->refDirectParents();
			auto it = std::find_if(clParents.cbegin(), clParents.cend(), [&](const Class* clParent) {
				return clParent->getName() == name; });
			if (it != clParents.cend()) {
				auto* clParent = *it;

				if (!hasArgs) {
					setExplicitSuper(targetRef, clParent);
					return EvaluationResult::Succeeded;
				}
				if (findConstructorCall(targetRef, clParent, StringId::Invalid))
					return EvaluationResult::Succeeded;
			}
		}

		// check "super.constructor()" style
		if (hasName && hasArgs) {
			for (auto* clParent : cl->refDirectParents()) {
				if (findConstructorCall(targetRef, clParent, name))
					return EvaluationResult::Succeeded;
			}
		}

		if (findOnObject(targetRef, cl->refSuperMethods(), nullptr))
			return EvaluationResult::Succeeded;

		clTarget = cl;
		break;
	}

	case Type::ExplicitSuper: {
		// check "super.Class.constructor()" style
		if (hasName && hasArgs && findConstructorCall(targetRef, cl, name))
			return EvaluationResult::Succeeded;

		if (findOnObject(targetRef, cl->refMethods(), cl))
			return EvaluationResult::Succeeded;
		clTarget = cl;
		break;
	}

	default:
		throw InternalError();
	}

	if (partialEvaluation(SIZE_MAX, clTarget))
		return EvaluationResult::Partial;

	if (throwIfNotFound) {
		if (clTarget == nullptr)
			errorAtNode(thread, ErrorLevel::Error, node, "expected expression", {});
		else {
			errorAtNode(thread, ErrorLevel::Error, node, R"*(no method or member named "${0}${1}" in class "${2}")*",
					{thread.sTable->ref(name), toString(thread.sTable, args), thread.sTable->ref(clTarget->getName())});
		}
		throw RuntimeException(StringId::MemberNotFoundException);
	}

	return EvaluationResult::Failed;
}